

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofMemberHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  bool bVar1;
  char *format_00;
  
  bVar1 = anon_unknown_0::HasHasMethod(field);
  if (bVar1) {
    format_00 = 
    "inline bool $classname$::_internal_has_$name$() const {\n  return $oneof_name$_case() == k$field_name$;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
    ;
  }
  else {
    bVar1 = anon_unknown_0::HasPrivateHasMethod(field);
    if (!bVar1) goto LAB_002d5d0a;
    format_00 = 
    "inline bool $classname$::_internal_has_$name$() const {\n  return $oneof_name$_case() == k$field_name$;\n}\n"
    ;
  }
  Formatter::operator()<>(format,format_00);
LAB_002d5d0a:
  Formatter::operator()<>
            (format,
             "inline void $classname$::set_has_$name$() {\n  _oneof_case_[$oneof_index$] = k$field_name$;\n}\n"
            );
  return;
}

Assistant:

void MessageGenerator::GenerateOneofMemberHasBits(const FieldDescriptor* field,
                                                  const Formatter& format) {
  if (IsFieldStripped(field, options_)) {
    if (HasHasMethod(field)) {
      format(
          "inline bool $classname$::has_$name$() const { "
          "__builtin_trap(); }\n");
    }
    format(
        "inline void $classname$::set_has_$name$() { __builtin_trap(); "
        "}\n");
    return;
  }
  // Singular field in a oneof
  // N.B.: Without field presence, we do not use has-bits or generate
  // has_$name$() methods, but oneofs still have set_has_$name$().
  // Oneofs also have has_$name$() but only as a private helper
  // method, so that generated code is slightly cleaner (vs.  comparing
  // _oneof_case_[index] against a constant everywhere).
  //
  // If has_$name$() is private, there is no need to add an internal accessor.
  // Only annotate public accessors.
  if (HasHasMethod(field)) {
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  return $oneof_name$_case() == k$field_name$;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else if (HasPrivateHasMethod(field)) {
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  return $oneof_name$_case() == k$field_name$;\n"
        "}\n");
  }
  // set_has_$name$() for oneof fields is always private; hence should not be
  // annotated.
  format(
      "inline void $classname$::set_has_$name$() {\n"
      "  _oneof_case_[$oneof_index$] = k$field_name$;\n"
      "}\n");
}